

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotation.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotation::Update(ChLinkMotorRotation *this,double mytime,bool update_assets)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChBodyFrame *pCVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ChFrameMoving<double> aframe12;
  ChFrameMoving<double> aframe2;
  ChFrameMoving<double> aframe1;
  ChQuaternion<double> local_458;
  ChFrameMoving<double> local_430;
  undefined1 local_338 [16];
  double local_328;
  undefined1 local_318 [16];
  double dStack_308;
  double dStack_300;
  double dStack_2f8;
  double local_2f0;
  double dStack_2e8;
  double local_2e0;
  double local_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double local_298;
  double local_290;
  double dStack_288;
  double dStack_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double local_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  double local_230;
  double dStack_228;
  ChFrameMoving<double> local_220;
  ChFrameMoving<double> local_128;
  
  ChLinkMotor::Update(&this->super_ChLinkMotor,mytime,update_assets);
  local_220.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.pos.m_data[0];
  local_220.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.pos.m_data[1];
  local_220.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.pos.m_data[2];
  local_220.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[0];
  local_220.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[1];
  local_220.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[2];
  local_220.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.coord.rot.m_data[3];
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x10);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x18);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x20);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x28);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x30);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x38);
  local_220.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x40);
  local_220.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_220.coord_dt.pos.m_data[0] = 0.0;
  local_220.coord_dt.pos.m_data[1] = 0.0;
  local_220.coord_dt.pos.m_data[2] = 0.0;
  local_220.coord_dt.rot.m_data[0] = 0.0;
  local_220.coord_dt.rot.m_data[1] = 0.0;
  local_220.coord_dt.rot.m_data[2] = 0.0;
  local_220.coord_dt.rot.m_data[3] = 0.0;
  local_220.coord_dtdt.pos.m_data[0] = 0.0;
  local_220.coord_dtdt.pos.m_data[1] = 0.0;
  local_220.coord_dtdt.pos.m_data[2] = 0.0;
  local_220.coord_dtdt.rot.m_data[0] = 0.0;
  local_220.coord_dtdt.rot.m_data[1] = 0.0;
  local_220.coord_dtdt.rot.m_data[2] = 0.0;
  local_220.coord_dtdt.rot.m_data[3] = 0.0;
  pCVar8 = (this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body1;
  local_430.super_ChFrame<double>.coord.pos.m_data[0] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  local_430.super_ChFrame<double>.coord.pos.m_data[1] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_430.super_ChFrame<double>.coord.pos.m_data[2] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  local_430.super_ChFrame<double>.coord.rot.m_data[0] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_430.super_ChFrame<double>.coord.rot.m_data[1] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_430.super_ChFrame<double>.coord.rot.m_data[2] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_430.super_ChFrame<double>.coord.rot.m_data[3] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  local_430.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_430.coord_dt.pos.m_data[0] = (pCVar8->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  local_430.coord_dt.pos.m_data[1] = (pCVar8->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  local_430.coord_dt.pos.m_data[2] = (pCVar8->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  local_430.coord_dt.rot.m_data[0] = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_430.coord_dt.rot.m_data[1] = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_430.coord_dt.rot.m_data[2] = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_430.coord_dt.rot.m_data[3] = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  local_430.coord_dtdt.pos.m_data[0] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_430.coord_dtdt.pos.m_data[1] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  local_430.coord_dtdt.pos.m_data[2] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  local_430.coord_dtdt.rot.m_data[0] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[0];
  local_430.coord_dtdt.rot.m_data[1] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
  local_430.coord_dtdt.rot.m_data[2] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
  local_430.coord_dtdt.rot.m_data[3] =
       (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  local_318._0_8_ = (_func_int **)0x3ff0000000000000;
  local_458.m_data[2] = 0.0;
  dStack_300 = 0.0;
  register0x00001200 = ZEXT816(0) << 0x20;
  local_458.m_data[0] = 0.0;
  local_458.m_data[1] = SUB168(ZEXT816(0),4);
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_458,(ChQuaternion<double> *)local_318);
  ChFrameMoving<double>::TransformLocalToParent(&local_430,&local_220,&local_128);
  local_430.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.pos.m_data[0];
  local_430.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.pos.m_data[1];
  local_430.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.pos.m_data[2];
  local_430.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[0];
  local_430.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[1];
  local_430.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[2];
  local_430.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.coord.rot.m_data[3];
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x10);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x18);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x20);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x28);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x30);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x38);
  local_430.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 0x40);
  local_430.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_430.coord_dt.pos.m_data[0] = 0.0;
  local_430.coord_dt.pos.m_data[1] = 0.0;
  local_430.coord_dt.pos.m_data[2] = 0.0;
  local_430.coord_dt.rot.m_data[0] = 0.0;
  local_430.coord_dt.rot.m_data[1] = 0.0;
  local_430.coord_dt.rot.m_data[2] = 0.0;
  local_430.coord_dt.rot.m_data[3] = 0.0;
  local_430.coord_dtdt.pos.m_data[0] = 0.0;
  local_430.coord_dtdt.pos.m_data[1] = 0.0;
  local_430.coord_dtdt.pos.m_data[2] = 0.0;
  local_430.coord_dtdt.rot.m_data[0] = 0.0;
  local_430.coord_dtdt.rot.m_data[1] = 0.0;
  local_430.coord_dtdt.rot.m_data[2] = 0.0;
  local_430.coord_dtdt.rot.m_data[3] = 0.0;
  pCVar8 = (this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body2;
  local_318._8_8_ = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dStack_308 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dStack_300 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dStack_2f8 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_2f0 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  dStack_2e8 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_2e0 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_2d8 = (pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
              super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  dStack_2d0 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 8);
  dStack_2c8 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x10);
  dStack_2c0 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x18);
  dStack_2b8 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  dStack_2b0 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x28);
  dStack_2a8 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x30);
  dStack_2a0 = *(double *)
                ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x38);
  local_298 = *(double *)
               ((long)&(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                       super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
               + 0x40);
  local_318._0_8_ = &PTR__ChFrame_00b036f0;
  local_290 = (pCVar8->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  dStack_288 = (pCVar8->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  dStack_280 = (pCVar8->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  dStack_278 = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  dStack_270 = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  dStack_268 = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  dStack_260 = (pCVar8->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  dStack_258 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_250 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  dStack_248 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  dStack_240 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[0];
  dStack_238 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
  local_230 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
  dStack_228 = (pCVar8->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  local_328 = 0.0;
  local_338 = ZEXT816(0) << 0x20;
  local_458.m_data[0] = 1.0;
  local_458.m_data[1] = 0.0;
  local_458.m_data[2] = SUB168(ZEXT816(0),4);
  local_458.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_220,(ChVector<double> *)local_338,&local_458);
  ChFrameMoving<double>::TransformLocalToParent
            ((ChFrameMoving<double> *)local_318,&local_430,&local_220);
  local_458.m_data[2] = 0.0;
  local_318._0_8_ = (_func_int **)0x3ff0000000000000;
  dStack_300 = 0.0;
  local_458.m_data[0] = 0.0;
  local_458.m_data[1] = 0.0;
  stack0xfffffffffffffcf0 = ZEXT816(0);
  ChFrameMoving<double>::ChFrameMoving
            (&local_430,(ChVector<double> *)&local_458,(ChQuaternion<double> *)local_318);
  ChFrameMoving<double>::TransformParentToLocal(&local_220,&local_128,&local_430);
  dVar1 = this->mrot;
  dVar12 = remainder(dVar1,6.283185307179586);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_430.super_ChFrame<double>.coord.rot.m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_430.super_ChFrame<double>.coord.rot.m_data[2] *
       local_430.super_ChFrame<double>.coord.rot.m_data[2];
  auVar14 = vfmadd231sd_fma(auVar14,auVar17,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_430.super_ChFrame<double>.coord.rot.m_data[3];
  auVar14 = vfmadd231sd_fma(auVar14,auVar18,auVar18);
  if (auVar14._0_8_ <= 1e-30) {
    dVar13 = local_430.super_ChFrame<double>.coord.rot.m_data[3] +
             local_430.super_ChFrame<double>.coord.rot.m_data[3];
  }
  else {
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    dVar13 = atan2(auVar14._0_8_,local_430.super_ChFrame<double>.coord.rot.m_data[0]);
    dVar13 = ((dVar13 + dVar13) / auVar14._0_8_) *
             local_430.super_ChFrame<double>.coord.rot.m_data[3];
  }
  dVar13 = remainder(dVar13,6.283185307179586);
  auVar22._8_8_ = 0x7fffffffffffffff;
  auVar22._0_8_ = 0x7fffffffffffffff;
  dVar1 = dVar13 + (dVar1 - dVar12);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar13 - dVar12;
  auVar14 = vandpd_avx(auVar24,auVar22);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (dVar13 + 6.283185307179586) - dVar12;
  auVar17 = vandpd_avx(auVar20,auVar22);
  uVar9 = vcmpsd_avx512f(auVar17,auVar14,1);
  bVar10 = (bool)((byte)uVar9 & 1);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (dVar13 + -6.283185307179586) - dVar12;
  auVar17 = vandpd_avx(auVar15,auVar22);
  uVar9 = vcmpsd_avx512f(auVar17,auVar14,1);
  bVar11 = (bool)((byte)uVar9 & 1);
  this->mrot = (double)((ulong)bVar11 * (long)(dVar1 + -6.283185307179586) +
                       (ulong)!bVar11 *
                       ((ulong)bVar10 * (long)(dVar1 + 6.283185307179586) +
                       (ulong)!bVar10 * (long)dVar1));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_430.coord_dt.rot.m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_430.super_ChFrame<double>.coord.rot.m_data[3] * -2.0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (local_430.super_ChFrame<double>.coord.rot.m_data[2] +
       local_430.super_ChFrame<double>.coord.rot.m_data[2]) * local_430.coord_dt.rot.m_data[1];
  auVar14 = vfmadd231sd_fma(auVar25,auVar21,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_430.coord_dt.rot.m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_430.super_ChFrame<double>.coord.rot.m_data[1] * -2.0;
  auVar14 = vfmadd231sd_fma(auVar14,auVar23,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_430.coord_dt.rot.m_data[3];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_430.super_ChFrame<double>.coord.rot.m_data[0] +
       local_430.super_ChFrame<double>.coord.rot.m_data[0];
  auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar4);
  this->mrot_dt = auVar14._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_430.coord_dtdt.rot.m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (local_430.super_ChFrame<double>.coord.rot.m_data[2] +
       local_430.super_ChFrame<double>.coord.rot.m_data[2]) * local_430.coord_dtdt.rot.m_data[1];
  auVar14 = vfmadd231sd_fma(auVar19,auVar21,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_430.coord_dtdt.rot.m_data[2];
  auVar14 = vfmadd231sd_fma(auVar14,auVar23,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_430.coord_dtdt.rot.m_data[3];
  auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar7);
  this->mrot_dtdt = auVar14._0_8_;
  return;
}

Assistant:

void ChLinkMotorRotation::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotor::Update(mytime, update_assets);

    // compute aux data for future reference (istantaneous pos speed accel)
    ChFrameMoving<> aframe1 = ChFrameMoving<>(this->frame1) >> (ChFrameMoving<>)(*this->Body1);
    ChFrameMoving<> aframe2 = ChFrameMoving<>(this->frame2) >> (ChFrameMoving<>)(*this->Body2);
    ChFrameMoving<> aframe12;
    aframe2.TransformParentToLocal(aframe1, aframe12);

    // multi-turn rotation code
    double last_totrot = this->mrot;
    double last_rot = remainder(last_totrot, CH_C_2PI);
    double last_turns = last_totrot - last_rot;
    double new_rot = remainder(aframe12.GetRot().Q_to_Rotv().z(), CH_C_2PI);
    this->mrot = last_turns + new_rot;
    if (fabs(new_rot + CH_C_2PI - last_rot) < fabs(new_rot - last_rot))
        this->mrot = last_turns + new_rot + CH_C_2PI;
    if (fabs(new_rot - CH_C_2PI - last_rot) < fabs(new_rot - last_rot))
        this->mrot = last_turns + new_rot - CH_C_2PI;

    this->mrot_dt = aframe12.GetWvel_loc().z();
    this->mrot_dtdt = aframe12.GetWacc_loc().z();
}